

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsStateQueryUtil.cpp
# Opt level: O3

void deqp::gls::StateQueryUtil::verifyFloat
               (ResultCollector *result,QueriedState *state,float expected)

{
  ostream *poVar1;
  int iVar2;
  int iVar3;
  float fVar4;
  float fVar5;
  ostringstream buf;
  string local_1d0;
  ostringstream local_1b0 [112];
  ios_base local_140 [264];
  Enum<int,_1UL> local_38;
  
  switch(state->m_type) {
  case DATATYPE_BOOLEAN:
    if ((state->m_v).vBool == (expected != 0.0)) {
      return;
    }
    std::__cxx11::ostringstream::ostringstream(local_1b0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b0,"Expected ",9);
    local_1d0._M_string_length._0_4_ = -(uint)(expected != 0.0) & 1;
    local_1d0._M_dataplus._M_p = (pointer)glu::getBooleanName;
    poVar1 = tcu::Format::Enum<int,_1UL>::toStream
                       ((Enum<int,_1UL> *)&local_1d0,(ostream *)local_1b0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,", got ",6);
    local_38.m_getName = glu::getBooleanName;
    local_38.m_value = (int)(state->m_v).vBool;
    tcu::Format::Enum<int,_1UL>::toStream(&local_38,poVar1);
    std::__cxx11::stringbuf::str();
    tcu::ResultCollector::fail(result,&local_1d0);
    break;
  case DATATYPE_INTEGER:
    fVar4 = ceilf(expected + -0.5);
    iVar2 = (int)fVar4;
    fVar4 = floorf(expected + 0.5);
    iVar3 = (int)fVar4;
    if ((state->m_v).vInt <= iVar3 && iVar2 <= (state->m_v).vInt) {
      return;
    }
    std::__cxx11::ostringstream::ostringstream(local_1b0);
    if (iVar2 == iVar3) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b0,"Expected ",9);
      poVar1 = (ostream *)std::ostream::operator<<(local_1b0,iVar2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,", got ",6);
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1b0,"Expected in range [",0x13);
      poVar1 = (ostream *)std::ostream::operator<<(local_1b0,iVar2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,iVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"], got ",7);
    }
    std::ostream::operator<<(poVar1,(state->m_v).vInt);
    std::__cxx11::stringbuf::str();
    tcu::ResultCollector::fail(result,&local_1d0);
    break;
  case DATATYPE_INTEGER64:
    fVar4 = ceilf(expected + -0.5);
    fVar5 = floorf(expected + 0.5);
    if ((state->m_v).vInt64 <= (long)fVar5 && (long)fVar4 <= (state->m_v).vInt64) {
      return;
    }
    std::__cxx11::ostringstream::ostringstream(local_1b0);
    if ((long)fVar4 == (long)fVar5) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b0,"Expected ",9);
      poVar1 = std::ostream::_M_insert<long>((long)local_1b0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,", got ",6);
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1b0,"Expected in range [",0x13);
      poVar1 = std::ostream::_M_insert<long>((long)local_1b0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
      poVar1 = std::ostream::_M_insert<long>((long)poVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"], got ",7);
    }
    std::ostream::_M_insert<long>((long)poVar1);
    std::__cxx11::stringbuf::str();
    tcu::ResultCollector::fail(result,&local_1d0);
    break;
  case DATATYPE_FLOAT:
    if (((state->m_v).vFloat == expected) && (!NAN((state->m_v).vFloat) && !NAN(expected))) {
      return;
    }
    std::__cxx11::ostringstream::ostringstream(local_1b0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b0,"Expected ",9);
    poVar1 = std::ostream::_M_insert<double>((double)expected);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,", got ",6);
    std::ostream::_M_insert<double>((double)(state->m_v).vFloat);
    std::__cxx11::stringbuf::str();
    tcu::ResultCollector::fail(result,&local_1d0);
    break;
  case DATATYPE_UNSIGNED_INTEGER:
    fVar4 = ceilf(expected + -0.5);
    fVar5 = floorf(expected + 0.5);
    if ((state->m_v).vUint <= (uint)(long)fVar5 && (uint)(long)fVar4 <= (state->m_v).vUint) {
      return;
    }
    std::__cxx11::ostringstream::ostringstream(local_1b0);
    if ((uint)(long)fVar4 == (uint)(long)fVar5) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b0,"Expected ",9);
      poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)local_1b0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,", got ",6);
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1b0,"Expected in range [",0x13);
      poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)local_1b0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
      poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"], got ",7);
    }
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__cxx11::stringbuf::str();
    tcu::ResultCollector::fail(result,&local_1d0);
    break;
  default:
    goto switchD_007cc6d5_default;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream(local_1b0);
  std::ios_base::~ios_base(local_140);
switchD_007cc6d5_default:
  return;
}

Assistant:

DataType QueriedState::getType (void) const
{
	return m_type;
}